

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tinsert(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  int local_24;
  int local_20;
  int i;
  int pos;
  int e;
  lua_State *L_local;
  
  luaL_checktype(L,1,5);
  local_24 = luaL_len(L,1);
  local_24 = local_24 + 1;
  iVar1 = lua_gettop(L);
  local_20 = local_24;
  if (iVar1 != 2) {
    if (iVar1 != 3) {
      iVar1 = luaL_error(L,"wrong number of arguments to \'insert\'");
      return iVar1;
    }
    lVar2 = luaL_checkinteger(L,2);
    local_20 = (int)lVar2;
    if ((local_20 < 1) || (local_24 < local_20)) {
      luaL_argerror(L,2,"position out of bounds");
    }
    for (; local_20 < local_24; local_24 = local_24 + -1) {
      lua_rawgeti(L,1,local_24 + -1);
      lua_rawseti(L,1,local_24);
    }
  }
  lua_rawseti(L,1,local_20);
  return 0;
}

Assistant:

static int tinsert (lua_State *L) {
  int e = aux_getn(L, 1) + 1;  /* first empty element */
  int pos;  /* where to insert new element */
  switch (lua_gettop(L)) {
    case 2: {  /* called with only 2 arguments */
      pos = e;  /* insert new element at the end */
      break;
    }
    case 3: {
      int i;
      pos = luaL_checkint(L, 2);  /* 2nd argument is the position */
      luaL_argcheck(L, 1 <= pos && pos <= e, 2, "position out of bounds");
      for (i = e; i > pos; i--) {  /* move up elements */
        lua_rawgeti(L, 1, i-1);
        lua_rawseti(L, 1, i);  /* t[i] = t[i-1] */
      }
      break;
    }
    default: {
      return luaL_error(L, "wrong number of arguments to " LUA_QL("insert"));
    }
  }
  lua_rawseti(L, 1, pos);  /* t[pos] = v */
  return 0;
}